

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keybdnu.c
# Opt level: O1

char * al_keycode_to_name(int keycode)

{
  char *pcVar1;
  
  if (new_keyboard_driver->keycode_to_name == (_func_char_ptr_int *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = (*new_keyboard_driver->keycode_to_name)(keycode);
  }
  if (pcVar1 == (char *)0x0) {
    pcVar1 = _al_keyboard_common_names[keycode];
  }
  return pcVar1;
}

Assistant:

const char *al_keycode_to_name(int keycode)
{
   const char *name = NULL;

   ASSERT(new_keyboard_driver);
   ASSERT((keycode >= 0) && (keycode < ALLEGRO_KEY_MAX));

   if (new_keyboard_driver->keycode_to_name)
      name = new_keyboard_driver->keycode_to_name(keycode);

   if (!name)
      name = _al_keyboard_common_names[keycode];

   ASSERT(name);

   return name;
}